

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

ssize_t __thiscall Hpipe::Lexer::read(Lexer *this,int __fd,void *__buf,size_t __nbytes)

{
  ErrorList *this_00;
  bool bVar1;
  Lexer *this_01;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  undefined4 in_register_00000034;
  Lexem *pLVar6;
  bool bVar7;
  allocator local_141;
  string local_140;
  Lexem *local_120;
  Lexem *next;
  string local_110;
  Lexer *local_f0;
  Lexem *item_1;
  Lexem *item;
  undefined4 local_d8;
  int num_grp;
  int behavior [16];
  int inc;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char *local_38;
  char *data;
  Lexer *pLStack_28;
  int i;
  Lexem *res;
  Source *source_local;
  Lexer *this_local;
  
  pLVar6 = (Lexem *)CONCAT44(in_register_00000034,__fd);
  this->last = &this->first_item;
  while (this->last->next != (Lexem *)0x0) {
    this->last = this->last->next;
  }
  pLStack_28 = (Lexer *)this->last;
  for (data._4_4_ = 0; data._4_4_ < 0x10; data._4_4_ = data._4_4_ + 1) {
    this->sibling[data._4_4_] = (Lexem *)0x0;
  }
  local_38 = *(char **)&pLVar6->str;
  res = pLVar6;
  source_local = (Source *)this;
  if (local_38 == (char *)0x0) {
    this_00 = this->error_list;
    pcVar5 = pLVar6->beg;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,pcVar5,&local_79);
    std::operator+(&local_58,"Impossible to open ",&local_78);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    ErrorList::add(this_00,(Source *)pLVar6,(char *)0x0,pcVar5);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    this_local = pLStack_28;
  }
  else {
    while (iVar4 = read_tok(this,(Source *)res,local_38), iVar4 != 0) {
      local_38 = local_38 + iVar4;
    }
    behavior[4] = 2;
    behavior[3] = 3;
    behavior[2] = 3;
    behavior[1] = 1;
    behavior[0] = 3;
    num_grp = 0;
    local_d8 = 1;
    behavior[5] = 1;
    for (item._4_4_ = 0xf; -1 < item._4_4_; item._4_4_ = item._4_4_ + -1) {
      for (item_1 = this->sibling[item._4_4_]; item_1 != (Lexem *)0x0; item_1 = item_1->sibling) {
        switch((&local_d8)[item._4_4_]) {
        case 0:
          break;
        case 1:
          assemble_larg(this,item_1);
          break;
        case 2:
          assemble_rarg(this,item_1);
          break;
        case 3:
          assemble_barg(this,item_1,1,1);
        }
      }
    }
    for (local_f0 = pLStack_28; this_01 = local_f0, local_f0 != (Lexer *)0x0;
        local_f0 = (Lexer *)local_f0->sibling[10]) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_110,"=",(allocator *)((long)&next + 7));
      bVar2 = Lexem::eq((Lexem *)this_01,OPERATOR,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator((allocator<char> *)((long)&next + 7));
      if (bVar2) {
        local_120 = local_f0->sibling[10];
        while( true ) {
          pLVar6 = local_120;
          bVar1 = false;
          bVar2 = false;
          bVar7 = true;
          if (local_120 != (Lexem *)0x0) {
            std::allocator<char>::allocator();
            bVar1 = true;
            std::__cxx11::string::string((string *)&local_140,"=",&local_141);
            bVar2 = true;
            bVar3 = Lexem::eq(pLVar6,OPERATOR,&local_140);
            bVar7 = true;
            if ((((!bVar3) && (bVar7 = true, local_120->type != TEST)) &&
                (bVar7 = true, local_120->type != TRAINING)) &&
               (bVar7 = true, local_120->type != METHODS)) {
              bVar7 = local_120->type == FLAGS;
            }
          }
          if (bVar2) {
            std::__cxx11::string::~string((string *)&local_140);
          }
          if (bVar1) {
            std::allocator<char>::~allocator((allocator<char> *)&local_141);
          }
          if (bVar7) break;
          local_120 = local_120->next;
        }
        if (local_120 != local_f0->sibling[10]) {
          local_f0->sibling[8] = local_f0->sibling[10];
          local_f0->sibling[10]->parent = (Lexem *)local_f0;
          local_f0->sibling[10]->prev = (Lexem *)0x0;
          if (local_120 != (Lexem *)0x0) {
            local_120->prev->next = (Lexem *)0x0;
            local_120->prev = (Lexem *)local_f0;
          }
          local_f0->sibling[10] = local_120;
        }
      }
    }
    this_local = (Lexer *)pLStack_28->sibling[10];
  }
  return (ssize_t)this_local;
}

Assistant:

Lexem *Lexer::read( Source *source ) {
    // init
    last = &first_item;
    while ( last->next )
        last = last->next;
    Lexem *res = last;

    for( int i = 0; i < max_op_grp; ++i )
        sibling[ i ] = 0;

    // tokenize
    const char *data = source->data;
    if ( not data ) {
        error_list.add( source, 0, ( "Impossible to open " + std::string( source->provenance ) ).c_str() );
        return res;
    }

    while ( int inc = read_tok( source, data ) )
        data += inc;

    // operators
    enum { need_none = 0, need_larg = 1, need_rarg = 2, need_barg = 3 };
    int behavior[ max_op_grp ];
    #define OPERATOR( S, N, G ) behavior[ G ] = N;
    #include "Operators.h"
    #undef OPERATOR

    for( int num_grp = max_op_grp - 1; num_grp >= 0; --num_grp ) {
        for( Lexem *item = sibling[ num_grp ]; item; item = item->sibling ) {
            switch( behavior[ num_grp ] ) {
            case need_none: break;
            case need_larg: assemble_larg( item ); break;
            case need_rarg: assemble_rarg( item ); break;
            case need_barg: assemble_barg( item ); break;
            }
        }
    }

    // assemble machines
    for( Lexem *item = res; item; item = item->next ) {
        if ( item->eq( Lexem::OPERATOR, "=" ) ) {
            for( Lexem *next = item->next; ; next = next->next ) {
                if ( not next or next->eq( Lexem::OPERATOR, "=" ) or next->type == Lexem::TEST or next->type == Lexem::TRAINING or next->type == Lexem::METHODS or next->type == Lexem::FLAGS ) {
                    if ( next != item->next ) {
                        item->children[ 1 ] = item->next;
                        item->next->parent = item;
                        item->next->prev = 0;
                        if ( next ) {
                            next->prev->next = 0;
                            next->prev = item;
                        }
                        item->next = next;
                    }
                    break;
                }
            }
        }
    }

    return res->next;
}